

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O1

bool __thiscall lan::db::get<bool>(db *this,string *context,string *name,db_bit_type type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  db_bits *pdVar4;
  db_bit *pdVar5;
  invalid_argument *this_00;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar2 = (context->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + context->_M_string_length);
  pdVar4 = find_rec(this,&local_88,Container,this->first);
  this->data = pdVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (pdVar4 != (db_bits *)0x0) {
    paVar1 = &local_a8.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar2,pcVar2 + name->_M_string_length);
    pdVar5 = find_any(this,&local_a8,type,this->data->lin);
    this->data = pdVar5;
    if (pdVar5 == (db_bit *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pvVar3 = pdVar5->data;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (pvVar3 != (void *)0x0) {
        return (bool)*this->data->data;
      }
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + name->_M_string_length);
  error_string(&local_48,this,_bit_name_error,&local_68);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

any get(std::string context, std::string const name, const lan::db_bit_type type){
            if ((data = find_rec(context, lan::Container, first))) {
                if((data = find_any(name, type, data->lin)) and data->data){
                    any * data_p = (any*)data->data;
                    return ((any&)*data_p);
                }
            } throw lan::errors::bit_name_error(error_string(errors::_private::_bit_name_error, name));
        }